

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

ExecutionResult *
fold(ExecutionResult *__return_storage_ptr__,
    list<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_> *l,
    longlong start,_func_longlong_longlong_longlong *llf,_func_double_double_double *df,
    bool start_with_first)

{
  _List_node_base *p_Var1;
  ExecutionResult *pEVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  runtime_error *this;
  long *plVar7;
  long *plVar8;
  _Sp_cp_type *__mem;
  _List_node_base *p_Var9;
  bool bVar10;
  double local_e8;
  longlong local_e0;
  shared_ptr<SchemeObject> local_c8;
  ExecutionResult *local_b8;
  _func_longlong_longlong_longlong *local_b0;
  _List_node_base *local_a8;
  shared_ptr<SchemeObject> local_a0;
  shared_ptr<SchemeObject> local_90;
  shared_ptr<SchemeObject> local_80;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  char local_50 [32];
  
  local_e8 = (double)start;
  p_Var9 = (l->
           super__List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  local_e0 = start;
  local_b8 = __return_storage_ptr__;
  local_b0 = llf;
  local_a8 = (_List_node_base *)l;
  if (p_Var9 == (_List_node_base *)l) {
    bVar10 = false;
  }
  else {
    bVar10 = false;
    do {
      p_Var1 = p_Var9[1]._M_next;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var9[1]._M_prev;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
      }
      local_c8.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)p_Var1;
      local_c8.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var6;
      bVar3 = is_int(&local_c8);
      if (bVar3) {
        bVar4 = false;
      }
      else {
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)p_Var1;
        local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var6;
        bVar4 = is_float(&local_80);
        bVar4 = !bVar4;
      }
      if ((!bVar3) &&
         (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_80.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_c8.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (bVar4) {
        this = (runtime_error *)__cxa_allocate_exception(0x10);
        (*(code *)p_Var1->_M_next[1]._M_next)(local_50,p_Var1);
        plVar7 = (long *)std::__cxx11::string::append(local_50);
        local_70 = (long *)*plVar7;
        plVar8 = plVar7 + 2;
        if (local_70 == plVar8) {
          local_60 = *plVar8;
          lStack_58 = plVar7[3];
          local_70 = &local_60;
        }
        else {
          local_60 = *plVar8;
        }
        local_68 = plVar7[1];
        *plVar7 = (long)plVar8;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::runtime_error::runtime_error(this,(string *)&local_70);
        *(undefined ***)this = &PTR__runtime_error_0016b300;
        __cxa_throw(this,&eval_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if ((start_with_first & 1U) == 0) {
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        local_a0.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)p_Var1;
        local_a0.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var6;
        bVar3 = is_float(&local_a0);
        if (local_a0.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a0.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (bVar3) {
          if (p_Var1 == (_List_node_base *)0x0) {
            lVar5 = 0;
          }
          else {
            lVar5 = __dynamic_cast(p_Var1,&SchemeObject::typeinfo,&SchemeFloat::typeinfo,0);
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          local_e8 = (*df)(local_e8,*(double *)(lVar5 + 8));
          bVar10 = true;
        }
        else if (bVar10) {
          if (p_Var1 == (_List_node_base *)0x0) {
            lVar5 = 0;
          }
          else {
            lVar5 = __dynamic_cast(p_Var1,&SchemeObject::typeinfo,&SchemeInt::typeinfo,0);
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          local_e8 = (*df)(local_e8,(double)*(long *)(lVar5 + 8));
        }
        else {
          if (p_Var1 == (_List_node_base *)0x0) {
            lVar5 = 0;
          }
          else {
            lVar5 = __dynamic_cast(p_Var1,&SchemeObject::typeinfo,&SchemeInt::typeinfo,0);
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          local_e0 = (*local_b0)(local_e0,*(longlong *)(lVar5 + 8));
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
          }
          if (p_Var1 == (_List_node_base *)0x0) {
            lVar5 = 0;
          }
          else {
            lVar5 = __dynamic_cast(p_Var1,&SchemeObject::typeinfo,&SchemeInt::typeinfo,0);
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          local_e8 = (*df)(local_e8,(double)*(long *)(lVar5 + 8));
        }
      }
      else {
        if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          }
        }
        local_90.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)p_Var1;
        local_90.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Var6;
        bVar3 = is_float(&local_90);
        if (local_90.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_90.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (bVar3) {
          if (p_Var1 == (_List_node_base *)0x0) {
            lVar5 = 0;
          }
          else {
            lVar5 = __dynamic_cast(p_Var1,&SchemeObject::typeinfo,&SchemeFloat::typeinfo,0);
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          local_e8 = *(double *)(lVar5 + 8);
          bVar10 = true;
        }
        else {
          if (p_Var1 == (_List_node_base *)0x0) {
            lVar5 = 0;
          }
          else {
            lVar5 = __dynamic_cast(p_Var1,&SchemeObject::typeinfo,&SchemeInt::typeinfo,0);
          }
          if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
            }
          }
          local_e0 = *(long *)(lVar5 + 8);
          local_e8 = (double)local_e0;
        }
        start_with_first = false;
      }
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
      }
      p_Var9 = (((_List_base<std::shared_ptr<SchemeObject>,_std::allocator<std::shared_ptr<SchemeObject>_>_>
                  *)&p_Var9->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var9 != local_a8);
  }
  p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
  pEVar2 = local_b8;
  p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_0016b080;
  p_Var6->_M_use_count = 1;
  p_Var6->_M_weak_count = 1;
  if (bVar10) {
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016b468;
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR__SchemeObject_0016b698;
    *(double *)&p_Var6[1]._M_use_count = local_e8;
  }
  else {
    p_Var6->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0016b418;
    p_Var6[1]._vptr__Sp_counted_base = (_func_int **)&PTR__SchemeObject_0016b638;
    p_Var6[1]._M_use_count = (undefined4)local_e0;
    p_Var6[1]._M_weak_count = local_e0._4_4_;
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var6->_M_use_count = 2;
  }
  local_b8->type = VALUE;
  (local_b8->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var6 + 1);
  (local_b8->value).super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var6;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
  }
  (local_b8->tail_context)._M_t.
  super___uniq_ptr_impl<TailContext,_std::default_delete<TailContext>_>._M_t.
  super__Tuple_impl<0UL,_TailContext_*,_std::default_delete<TailContext>_>.
  super__Head_base<0UL,_TailContext_*,_false>._M_head_impl = (TailContext *)0x0;
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  return pEVar2;
}

Assistant:

static ExecutionResult fold(const std::list<std::shared_ptr<SchemeObject>> &l, long long start,
                            long long (*llf)(long long, long long), double (*df)(double, double),
                            bool start_with_first = false)
{
    long long n = start;
    double d = start;
    bool is_double = false;
    for(auto i : l)
    {
        if(!is_int(i) && !is_float(i))
        {
            throw eval_error(i->external_repr() + " is not an number");
        }
        if(start_with_first)
        {
            if(is_float(i))
            {
                is_double = true;
                d = std::dynamic_pointer_cast<SchemeFloat>(i)->value;
            }
            else
            {
                d = n = std::dynamic_pointer_cast<SchemeInt>(i)->value;
            }
            start_with_first = false;
            continue;
        }
        if(is_float(i))
        {
            is_double = true;
            d = df(d, std::dynamic_pointer_cast<SchemeFloat>(i)->value);
        }
        else if(is_double)
        {
            d = df(d, std::dynamic_pointer_cast<SchemeInt>(i)->value);
        }
        else
        {
            n = llf(n, std::dynamic_pointer_cast<SchemeInt>(i)->value);
            d = df(d, std::dynamic_pointer_cast<SchemeInt>(i)->value);
        }
    }
    if(is_double)
        return to_object(std::make_shared<SchemeFloat>(d));
    else
        return to_object(std::make_shared<SchemeInt>(n));
}